

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::~TCPSocket(TCPSocket *this)

{
  ~TCPSocket((TCPSocket *)&this[-1].lastSendTime);
  return;
}

Assistant:

TCPSocket::~TCPSocket() {
	if(auto sp = this->timer.lock()) {
		sp->cancel();
	}
	::close(this->fd);

#ifdef USE_SSL
	if(this->ssl) {
		SSL_free(this->ssl);
	}
#endif

}